

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzBuffToBuffDecompress
              (char *dest,uint *destLen,char *source,uint sourceLen,int small,int verbosity)

{
  int iVar1;
  undefined4 in_ECX;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int ret;
  bz_stream strm;
  uint in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == (int *)0x0)) || (in_RDX == 0)) ||
     (((in_R8D != 0 && (in_R8D != 1)) || ((in_R9D < 0 || (4 < in_R9D)))))) {
    local_4 = -2;
  }
  else {
    local_4 = BZ2_bzDecompressInit
                        ((bz_stream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                         (int)in_stack_ffffffffffffff80);
    if (local_4 == 0) {
      iVar1 = *in_RSI;
      local_4 = BZ2_bzDecompress((bz_stream *)CONCAT44(in_stack_ffffffffffffff8c,in_ECX));
      if (local_4 == 0) {
        if (iVar1 == 0) {
          BZ2_bzDecompressEnd((bz_stream *)(ulong)in_stack_ffffffffffffff78);
          local_4 = -8;
        }
        else {
          BZ2_bzDecompressEnd((bz_stream *)(ulong)in_stack_ffffffffffffff78);
          local_4 = -7;
        }
      }
      else if (local_4 == 4) {
        *in_RSI = *in_RSI - iVar1;
        BZ2_bzDecompressEnd((bz_stream *)CONCAT44(4,in_stack_ffffffffffffff78));
        local_4 = 0;
      }
      else {
        BZ2_bzDecompressEnd((bz_stream *)CONCAT44(local_4,in_stack_ffffffffffffff78));
      }
    }
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzBuffToBuffDecompress) 
                           ( char*         dest, 
                             unsigned int* destLen,
                             char*         source, 
                             unsigned int  sourceLen,
                             int           small,
                             int           verbosity )
{
   bz_stream strm;
   int ret;

   if (dest == NULL || destLen == NULL || 
       source == NULL ||
       (small != 0 && small != 1) ||
       verbosity < 0 || verbosity > 4) 
          return BZ_PARAM_ERROR;

   strm.bzalloc = NULL;
   strm.bzfree = NULL;
   strm.opaque = NULL;
   ret = BZ2_bzDecompressInit ( &strm, verbosity, small );
   if (ret != BZ_OK) return ret;

   strm.next_in = source;
   strm.next_out = dest;
   strm.avail_in = sourceLen;
   strm.avail_out = *destLen;

   ret = BZ2_bzDecompress ( &strm );
   if (ret == BZ_OK) goto output_overflow_or_eof;
   if (ret != BZ_STREAM_END) goto errhandler;

   /* normal termination */
   *destLen -= strm.avail_out;
   BZ2_bzDecompressEnd ( &strm );
   return BZ_OK;

   output_overflow_or_eof:
   if (strm.avail_out > 0) {
      BZ2_bzDecompressEnd ( &strm );
      return BZ_UNEXPECTED_EOF;
   } else {
      BZ2_bzDecompressEnd ( &strm );
      return BZ_OUTBUFF_FULL;
   };      

   errhandler:
   BZ2_bzDecompressEnd ( &strm );
   return ret; 
}